

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurvesTests.cpp
# Opt level: O0

void __thiscall agge::tests::ArcCurveTests::FirstElementIsALineToTheEndPoint(ArcCurveTests *this)

{
  real_t rVar1;
  int iVar2;
  allocator local_1b1;
  string local_1b0 [32];
  LocationInfo local_190;
  allocator local_161;
  string local_160 [32];
  LocationInfo local_140;
  real_t local_114;
  real_t local_110;
  real_t y_1;
  real_t x_1;
  LocationInfo local_e8;
  allocator local_a9;
  string local_a8 [32];
  LocationInfo local_88;
  real_t local_60;
  real_t local_5c;
  real_t y;
  real_t x;
  real_t prev_y;
  real_t prev_x;
  arc a2;
  arc a1;
  ArcCurveTests *this_local;
  
  arc::arc((arc *)&a2._end,13.1,-17.2,10.1,0.0,1.5707964,0.05);
  arc::arc((arc *)&prev_y,-122.3,19.4,17.3,1.5707964,3.1415927,0.05);
  x = 0.0;
  y = 0.0;
  while( true ) {
    iVar2 = arc::vertex((arc *)&a2._end,&local_5c,&local_60);
    rVar1 = x;
    if (iVar2 == 0) break;
    x = local_5c;
    y = local_60;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_a8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/CurvesTests.cpp"
             ,&local_a9);
  ut::LocationInfo::LocationInfo(&local_88,(string *)local_a8,0x13a);
  ut::are_approx_equal<float>(13.1,rVar1,1e-05,&local_88);
  ut::LocationInfo::~LocationInfo(&local_88);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  rVar1 = y;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&x_1,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/CurvesTests.cpp"
             ,(allocator *)((long)&y_1 + 3));
  ut::LocationInfo::LocationInfo(&local_e8,(string *)&x_1,0x13b);
  ut::are_approx_equal<float>(-7.1,rVar1,1e-05,&local_e8);
  ut::LocationInfo::~LocationInfo(&local_e8);
  std::__cxx11::string::~string((string *)&x_1);
  std::allocator<char>::~allocator((allocator<char> *)((long)&y_1 + 3));
  while( true ) {
    iVar2 = arc::vertex((arc *)&prev_y,&local_110,&local_114);
    rVar1 = x;
    if (iVar2 == 0) break;
    x = local_110;
    y = local_114;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_160,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/CurvesTests.cpp"
             ,&local_161);
  ut::LocationInfo::LocationInfo(&local_140,(string *)local_160,0x142);
  ut::are_approx_equal<float>(-139.6,rVar1,1e-05,&local_140);
  ut::LocationInfo::~LocationInfo(&local_140);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  rVar1 = y;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1b0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/CurvesTests.cpp"
             ,&local_1b1);
  ut::LocationInfo::LocationInfo(&local_190,(string *)local_1b0,0x143);
  ut::are_approx_equal<float>(19.4,rVar1,1e-05,&local_190);
  ut::LocationInfo::~LocationInfo(&local_190);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  return;
}

Assistant:

test( FirstElementIsALineToTheEndPoint )
			{
				// INIT
				arc a1(13.1f, -17.2f, 10.1f, 0.0f * pi, 0.5f * pi);
				arc a2(-122.3f, 19.4f, 17.3f, 0.5f * pi, 1.0f * pi);
				real_t prev_x = 0.0f, prev_y = 0.0f;

				// ACT
				for (real_t x, y; path_command_stop != a1.vertex(&x, &y); )
					prev_x = x, prev_y = y;

				// ASSERT
				assert_approx_equal(13.1f, prev_x, 0.00001);
				assert_approx_equal(-7.1f, prev_y, 0.00001);

				// ACT
				for (real_t x, y; path_command_stop != a2.vertex(&x, &y); )
					prev_x = x, prev_y = y;

				// ASSERT
				assert_approx_equal(-139.6f, prev_x, 0.00001);
				assert_approx_equal(19.4f, prev_y, 0.00001);
			}